

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall upb::generator::Output::Write(Output *this,string_view data)

{
  bool bVar1;
  size_type sVar2;
  size_type in_R9;
  char *pcVar3;
  lts_20250127 *this_00;
  string_view prefix;
  string_view s;
  FixedMapping replacements;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> line_prefix;
  string last_line_prefix;
  string stripped;
  undefined1 local_78 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_58;
  string local_38;
  
  local_d8._M_str = data._M_str;
  local_d8._M_len = data._M_len;
  stripped._M_dataplus._M_p = (pointer)&stripped.field_2;
  stripped._M_string_length = 0;
  stripped.field_2._M_local_buf[0] = '\0';
  prefix._M_str = "\n ";
  prefix._M_len = 2;
  bVar1 = absl::lts_20250127::StartsWith(data,prefix);
  if (bVar1) {
    local_78._0_16_ =
         (undefined1  [16])
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   (&local_d8,1,0xffffffffffffffff);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_78,' ',0);
    if (sVar2 != 0xffffffffffffffff) {
      line_prefix = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              (&local_d8,0,sVar2 + 1);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&last_line_prefix,&line_prefix,(allocator<char> *)local_78);
      std::__cxx11::string::resize((ulong)&last_line_prefix);
      pcVar3 = local_d8._M_str + line_prefix._M_len;
      this_00 = (lts_20250127 *)(local_d8._M_len - line_prefix._M_len);
      local_78._0_8_ = line_prefix._M_len;
      local_78._8_8_ = line_prefix._M_str;
      local_78[0x10] = '\x01';
      local_78[0x11] = '\0';
      local_78[0x12] = '\0';
      local_78[0x13] = '\0';
      local_78[0x14] = '\0';
      local_78[0x15] = '\0';
      local_78[0x16] = '\0';
      local_78[0x17] = '\0';
      local_78._24_8_ = "\n";
      local_d8._M_len = (size_t)this_00;
      local_d8._M_str = pcVar3;
      std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[2],_true>
                ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)(local_78 + 0x20),&last_line_prefix,(char (*) [2])0x36e79e);
      s._M_str = local_78;
      s._M_len = (size_t)pcVar3;
      replacements._M_len = in_R9;
      replacements._M_array = (iterator)0x2;
      absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_38,this_00,s,replacements);
      std::__cxx11::string::operator=((string *)&stripped,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      local_d8._M_len = stripped._M_string_length;
      local_d8._M_str = stripped._M_dataplus._M_p;
      std::__cxx11::string::~string((string *)&last_line_prefix);
    }
  }
  local_78._8_8_ = local_d8._M_str;
  local_78._0_8_ = local_d8._M_len;
  absl::lts_20250127::StrAppend(&this->output_,(AlphaNum *)local_78);
  std::__cxx11::string::~string((string *)&stripped);
  return;
}

Assistant:

void Write(absl::string_view data) {
    std::string stripped;
    if (absl::StartsWith(data, "\n ")) {
      size_t indent = data.substr(1).find_first_not_of(' ');
      if (indent != absl::string_view::npos) {
        // Remove indentation from all lines.
        auto line_prefix = data.substr(0, indent + 1);
        // The final line has an extra newline and is indented two less, eg.
        //    R"cc(
        //      UPB_INLINE $0 $1_$2(const $1 *msg) {
        //        return $1_has_$2(msg) ? *UPB_PTR_AT(msg, $3, $0) : $4;
        //      }
        //    )cc",
        std::string last_line_prefix = std::string(line_prefix);
        last_line_prefix.resize(last_line_prefix.size() - 2);
        data.remove_prefix(line_prefix.size());
        stripped = absl::StrReplaceAll(
            data, {{line_prefix, "\n"}, {last_line_prefix, "\n"}});
        data = stripped;
      }
    }
    absl::StrAppend(&output_, data);
  }